

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall
pbrt::ParameterDictionary::ParameterDictionary
          (ParameterDictionary *this,ParsedParameterVector *p,RGBColorSpace *colorSpace)

{
  ParameterDictionary *this_00;
  memory_resource *in_RDX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  char (*unaff_retaddr) [22];
  char *in_stack_00000008;
  int in_stack_00000014;
  char *in_stack_00000018;
  LogLevel in_stack_00000024;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_01;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_ffffffffffffffd0,in_RDI);
  this_01[1].alloc.memoryResource = in_RDX;
  this_00 = (ParameterDictionary *)
            InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            ::begin(this_01);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::end(in_RDI);
  std::reverse<pbrt::ParsedParameter**>((ParsedParameter **)this_00,(ParsedParameter **)this_01);
  if (in_RDX == (memory_resource *)0x0) {
    LogFatal<char_const(&)[22]>
              (in_stack_00000024,in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr
              );
  }
  checkParameterTypes(this_00);
  return;
}

Assistant:

ParameterDictionary::ParameterDictionary(ParsedParameterVector p,
                                         const RGBColorSpace *colorSpace)
    : params(std::move(p)), colorSpace(colorSpace) {
    std::reverse(params.begin(), params.end());
    CHECK(colorSpace != nullptr);
    checkParameterTypes();
}